

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::(anonymous_namespace)::SocketAddress>::setCapacity
          (Vector<kj::(anonymous_namespace)::SocketAddress> *this,size_t newSize)

{
  SocketAddress *pSVar1;
  RemoveConst<kj::(anonymous_namespace)::SocketAddress> *pRVar2;
  size_t __n;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> newBuilder;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> local_38;
  
  pSVar1 = (this->builder).ptr;
  if (newSize < (ulong)(((long)(this->builder).pos - (long)pSVar1) / 0x88)) {
    (this->builder).pos = pSVar1 + newSize;
  }
  heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>(&local_38,newSize);
  pSVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pSVar1;
  if (__n != 0) {
    memcpy(local_38.pos,pSVar1,__n);
  }
  pRVar2 = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)((long)local_38.pos + __n);
  local_38.pos = pRVar2;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::dispose(&this->builder);
  (this->builder).ptr = local_38.ptr;
  (this->builder).pos = pRVar2;
  (this->builder).endPtr = local_38.endPtr;
  (this->builder).disposer = local_38.disposer;
  local_38.ptr = (SocketAddress *)0x0;
  local_38.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
  local_38.endPtr = (SocketAddress *)0x0;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }